

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

void __thiscall Eigen::IOFormat::IOFormat(IOFormat *this,IOFormat *param_1)

{
  pointer pcVar1;
  undefined3 uVar2;
  int iVar3;
  
  (this->matPrefix)._M_dataplus._M_p = (pointer)&(this->matPrefix).field_2;
  pcVar1 = (param_1->matPrefix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->matPrefix)._M_string_length);
  (this->matSuffix)._M_dataplus._M_p = (pointer)&(this->matSuffix).field_2;
  pcVar1 = (param_1->matSuffix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->matSuffix,pcVar1,pcVar1 + (param_1->matSuffix)._M_string_length);
  (this->rowPrefix)._M_dataplus._M_p = (pointer)&(this->rowPrefix).field_2;
  pcVar1 = (param_1->rowPrefix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowPrefix,pcVar1,pcVar1 + (param_1->rowPrefix)._M_string_length);
  (this->rowSuffix)._M_dataplus._M_p = (pointer)&(this->rowSuffix).field_2;
  pcVar1 = (param_1->rowSuffix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowSuffix,pcVar1,pcVar1 + (param_1->rowSuffix)._M_string_length);
  (this->rowSeparator)._M_dataplus._M_p = (pointer)&(this->rowSeparator).field_2;
  pcVar1 = (param_1->rowSeparator)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowSeparator,pcVar1,pcVar1 + (param_1->rowSeparator)._M_string_length)
  ;
  (this->rowSpacer)._M_dataplus._M_p = (pointer)&(this->rowSpacer).field_2;
  pcVar1 = (param_1->rowSpacer)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->rowSpacer,pcVar1,pcVar1 + (param_1->rowSpacer)._M_string_length);
  (this->coeffSeparator)._M_dataplus._M_p = (pointer)&(this->coeffSeparator).field_2;
  pcVar1 = (param_1->coeffSeparator)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->coeffSeparator,pcVar1,
             pcVar1 + (param_1->coeffSeparator)._M_string_length);
  this->flags = param_1->flags;
  uVar2 = *(undefined3 *)&param_1->field_0xe1;
  iVar3 = param_1->precision;
  this->fill = param_1->fill;
  *(undefined3 *)&this->field_0xe1 = uVar2;
  this->precision = iVar3;
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="", const char _fill=' ')
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), fill(_fill), precision(_precision), flags(_flags)
  {
    // TODO check if rowPrefix, rowSuffix or rowSeparator contains a newline
    // don't add rowSpacer if columns are not to be aligned
    if((flags & DontAlignCols))
      return;
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }